

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString __thiscall SimpleString::lowerCase(SimpleString *this)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  SimpleString *in_RSI;
  char cVar5;
  
  SimpleString(this,in_RSI);
  sVar3 = size(this);
  pcVar2 = this->buffer_;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    cVar1 = pcVar2[sVar4];
    cVar5 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar5 = cVar1;
    }
    pcVar2[sVar4] = cVar5;
  }
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString SimpleString::lowerCase() const
{
    SimpleString str(*this);

    size_t str_size = str.size();
    for (size_t i = 0; i < str_size; i++)
        str.buffer_[i] = ToLower(str.buffer_[i]);

    return str;
}